

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer>::assemble
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer> *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  array<unsigned_char,_4UL> aVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  char **__it;
  char **__it_00;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  array<unsigned_char,_4UL> ser;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  istringstream iss;
  undefined8 local_268;
  undefined1 local_258 [23];
  allocator_type local_241;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_210;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1e0;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)this,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_1e0,(istream_type *)local_1b0);
  paVar1 = &local_210._M_value.field_2;
  local_210._M_stream = (istream_type *)0x0;
  local_210._M_value._M_string_length = 0;
  local_210._M_value.field_2._M_local_buf[0] = '\0';
  local_210._M_ok = false;
  local_210._M_value._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             &local_1e0,&local_210,(allocator_type *)&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_value._M_dataplus._M_p,
                    CONCAT71(local_210._M_value.field_2._M_allocated_capacity._1_7_,
                             local_210._M_value.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_value._M_dataplus._M_p != &local_1e0._M_value.field_2) {
    operator_delete(local_1e0._M_value._M_dataplus._M_p,
                    local_1e0._M_value.field_2._M_allocated_capacity + 1);
  }
  if (local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] no instruction token","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 1;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  uVar5 = 4;
  lVar6 = 0x68;
  __it_00 = traits::instr_set_traits<(anonymous_namespace)::mini_set>::instr_names._M_elems;
  local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228;
  do {
    __it = __it_00;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_268,__it);
    __it_00 = __it;
    if (bVar2) goto LAB_00102d44;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_268,__it + 1);
    __it_00 = __it + 1;
    if (bVar2) goto LAB_00102d44;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_268,__it + 2);
    __it_00 = __it + 2;
    if (bVar2) goto LAB_00102d44;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_268,__it + 3);
    __it_00 = __it + 3;
    if (bVar2) goto LAB_00102d44;
    __it_00 = __it + 4;
    uVar5 = uVar5 - 1;
    lVar6 = lVar6 + -0x20;
  } while (1 < uVar5);
  lVar6 = lVar6 >> 3;
  if (lVar6 == 1) {
LAB_00102d2b:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
            ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                          *)&local_268,__it_00);
    if (bVar2) goto LAB_00102d44;
  }
  else {
    if (lVar6 == 3) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
              ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                            *)&local_268,__it_00);
      if (bVar2) goto LAB_00102d44;
      __it_00 = __it + 5;
LAB_00102d13:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
              ::operator()((_Iter_pred<mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                            *)&local_268,__it_00);
      if (bVar2) goto LAB_00102d44;
      __it_00 = __it_00 + 1;
      goto LAB_00102d2b;
    }
    if (lVar6 == 2) goto LAB_00102d13;
  }
  __it_00 = (char **)&mexcept::vtable;
LAB_00102d44:
  if ((array<const_char_*const,_13UL> *)__it_00 ==
      (array<const_char_*const,_13UL> *)&mexcept::vtable) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction name","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 2;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch((long)(__it_00 + -0x23b8d) >> 3) {
  case 0:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                ((ulong)local_268 & 0xffffffffffffff00);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l,&local_241);
    if ((long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_268._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_268,(uchar *)((long)&local_268 + 4),&local_240);
    break;
  case 1:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,1);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_00,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,2);
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_10,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,3);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_01,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,4);
    __l_11._M_len = 1;
    __l_11._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_11,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 5:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,5);
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_09,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,6);
    __l_08._M_len = 1;
    __l_08._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_08,&local_241)
    ;
    if ((long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_268._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_268,(uchar *)((long)&local_268 + 4),&local_240);
    break;
  case 7:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,7);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_06,&local_241)
    ;
    if ((long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_268._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_268,(uchar *)((long)&local_268 + 4),&local_240);
    break;
  case 8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,8);
    __l_07._M_len = 1;
    __l_07._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_07,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 9:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,9);
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_05,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 10:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,10);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_03,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 0xb:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,0xb);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_02,&local_241)
    ;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    break;
  case 0xc:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_228,
               (iterator)
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT71(local_268._1_7_,0xc);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&local_268;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__l_04,&local_241)
    ;
    if ((long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"[-][mvm] invalid instruction operands","");
      *puVar4 = &PTR__mexcept_0011dcf8;
      *(undefined2 *)(puVar4 + 1) = 4;
      __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
    }
    aVar3 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>
                      (local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_268._4_4_,aVar3._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_268,(uchar *)((long)&local_268 + 4),&local_240);
    break;
  case 0xd:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x10:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x11:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x12:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x13:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x14:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x15:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x16:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x17:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x18:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x19:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x20:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x21:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x22:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x23:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x24:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x25:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x26:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x27:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x28:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x29:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x30:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x31:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x32:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x33:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x34:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x35:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x36:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x37:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x38:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x39:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x40:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x41:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x42:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x43:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x44:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x45:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x46:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x47:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x48:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x49:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x50:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x51:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x52:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x53:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x54:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x55:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x56:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x57:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x58:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x59:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x60:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x61:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x62:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 99:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 100:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x65:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x66:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x67:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x68:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x69:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x70:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x71:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x72:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x73:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x74:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x75:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x76:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x77:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x78:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x79:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x80:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x81:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x82:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x83:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x84:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x85:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x86:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x87:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x88:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x89:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x90:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x91:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x92:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x93:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x94:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x95:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x96:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x97:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x98:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x99:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9a:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9b:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9c:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9d:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9e:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa0:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa1:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa2:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa3:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa4:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa5:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa6:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa7:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa8:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa9:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaa:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xab:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xac:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xad:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xae:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaf:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb0:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb1:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb2:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb3:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb4:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb5:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb6:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb7:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb8:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb9:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xba:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbb:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbc:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbd:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbe:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbf:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc0:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc1:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc2:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc3:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc4:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc5:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc6:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 199:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 200:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc9:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xca:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcb:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcc:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcd:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xce:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcf:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd0:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd1:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd2:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd3:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd4:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd5:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd6:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd7:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd8:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd9:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xda:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdb:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdc:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdd:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xde:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdf:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe0:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe1:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe2:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe3:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe4:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe5:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe6:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe7:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe8:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe9:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xea:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xeb:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xec:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xed:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xee:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xef:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf0:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf1:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf2:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf3:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf4:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf5:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf6:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf7:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf8:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf9:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfa:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfb:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfc:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfd:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfe:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xff:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] invalid instruction opcode","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 5;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  default:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_268 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"[-][mvm] instruction opcode overflow","");
    *puVar4 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar4 + 1) = 3;
    __cxa_throw(puVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (__return_storage_ptr__,&local_240);
  if (local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t>
assembler<Set, MetaCodeImpl>::assemble(std::string const &line) const {
  std::istringstream iss(line);
  std::vector<std::string> tokens(std::istream_iterator<std::string>{iss},
                                  std::istream_iterator<std::string>());

  if (tokens.empty()) // need at leat an instruction name
  {
    throw mexcept("[-][mvm] no instruction token", status_type::NO_INSTR_NAME);
  }

  auto iname_it = std::find_if(
      std::cbegin(instr_set_traits_type::instr_names),
      std::cend(instr_set_traits_type::instr_names),
      [&](auto const &val) { return std::string(val) == tokens[0]; });

  if (iname_it == std::cend(instr_set_traits_type::instr_names)) {
    throw mexcept("[-][mvm] invalid instruction name",
                  status_type::BAD_INSTR_NAME);
  }

  LOG_INFO("assembler -> assemble instruction " << *iname_it);

  std::vector<uint8_t> bytecode;
  auto instr_index =
      std::distance(std::cbegin(instr_set_traits_type::instr_names), iname_it);

#ifdef FASTI
#define MVM_ASSEMBLE_I(n)                                                      \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      bytecode = assemble_instr<instr_type>(                                   \
          static_cast<uint8_t>(n),                                             \
          (tokens.erase(std::begin(tokens)), tokens));                         \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;
  switch (instr_index) {
    MVM_UNROLL_256(MVM_ASSEMBLE_I)
  default:
    throw mexcept("[-][mvm] instruction opcode overflow",
                  status_type::INSTR_OPCODE_OVERFLOW);
  }
#else
  // visitor version suitable for small instruction sets
  instr_set_visitor<instr_set_desc_type>()(
      instr_index, [&tokens, &bytecode, instr_index, this](auto &&arg) {
        using instr_type = std::decay_t<decltype(arg)>;
        tokens.erase(std::begin(tokens));
        bytecode = this->assemble_instr<instr_type>(
            static_cast<uint8_t>(instr_index), tokens);
      });
#endif

  return bytecode;
}